

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrdrbg_test.cc
# Opt level: O2

void __thiscall CTRDRBGTest_Large_Test::TestBody(CTRDRBGTest_Large_Test *this)

{
  bool bVar1;
  int iVar2;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> out;
  char *message;
  char *in_R9;
  Bytes local_1e0;
  AssertionResult gtest_ar;
  __array buf;
  Bytes local_1b8;
  uint8_t digest [32];
  uint8_t kExpected [32];
  uint8_t kSeed [48];
  CTR_DRBG_STATE drbg;
  
  kSeed[0x20] = '\0';
  kSeed[0x21] = '\0';
  kSeed[0x22] = '\0';
  kSeed[0x23] = '\0';
  kSeed[0x24] = '\0';
  kSeed[0x25] = '\0';
  kSeed[0x26] = '\0';
  kSeed[0x27] = '\0';
  kSeed[0x28] = '\0';
  kSeed[0x29] = '\0';
  kSeed[0x2a] = '\0';
  kSeed[0x2b] = '\0';
  kSeed[0x2c] = '\0';
  kSeed[0x2d] = '\0';
  kSeed[0x2e] = '\0';
  kSeed[0x2f] = '\0';
  kSeed[0x10] = '\0';
  kSeed[0x11] = '\0';
  kSeed[0x12] = '\0';
  kSeed[0x13] = '\0';
  kSeed[0x14] = '\0';
  kSeed[0x15] = '\0';
  kSeed[0x16] = '\0';
  kSeed[0x17] = '\0';
  kSeed[0x18] = '\0';
  kSeed[0x19] = '\0';
  kSeed[0x1a] = '\0';
  kSeed[0x1b] = '\0';
  kSeed[0x1c] = '\0';
  kSeed[0x1d] = '\0';
  kSeed[0x1e] = '\0';
  kSeed[0x1f] = '\0';
  kSeed[0] = '\0';
  kSeed[1] = '\0';
  kSeed[2] = '\0';
  kSeed[3] = '\0';
  kSeed[4] = '\0';
  kSeed[5] = '\0';
  kSeed[6] = '\0';
  kSeed[7] = '\0';
  kSeed[8] = '\0';
  kSeed[9] = '\0';
  kSeed[10] = '\0';
  kSeed[0xb] = '\0';
  kSeed[0xc] = '\0';
  kSeed[0xd] = '\0';
  kSeed[0xe] = '\0';
  kSeed[0xf] = '\0';
  iVar2 = CTR_DRBG_init(&drbg,kSeed,(uint8_t *)0x0,0);
  kExpected[8] = '\0';
  kExpected[9] = '\0';
  kExpected[10] = '\0';
  kExpected[0xb] = '\0';
  kExpected[0xc] = '\0';
  kExpected[0xd] = '\0';
  kExpected[0xe] = '\0';
  kExpected[0xf] = '\0';
  bVar1 = iVar2 != 0;
  kExpected[0] = bVar1;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)digest,(internal *)kExpected,
               (AssertionResult *)"CTR_DRBG_init(&drbg, kSeed, nullptr, 0)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
               ,0x4d,(char *)digest._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    std::__cxx11::string::~string((string *)digest);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(kExpected + 8));
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(kExpected + 8));
    out.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0x10000);
    memset((void *)out.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,0x10000);
    buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         out.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    iVar2 = CTR_DRBG_generate(&drbg,(uint8_t *)
                                    out.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                              0x10000,(uint8_t *)0x0,0);
    kExpected[8] = '\0';
    kExpected[9] = '\0';
    kExpected[10] = '\0';
    kExpected[0xb] = '\0';
    kExpected[0xc] = '\0';
    kExpected[0xd] = '\0';
    kExpected[0xe] = '\0';
    kExpected[0xf] = '\0';
    kExpected[0] = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)digest,(internal *)kExpected,
                 (AssertionResult *)"CTR_DRBG_generate(&drbg, buf.get(), 65536, nullptr, 0)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
                 ,0x51,(char *)digest._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
      std::__cxx11::string::~string((string *)digest);
      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(kExpected + 8));
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(kExpected + 8));
      SHA256((uchar *)buf._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10000,digest);
      local_1e0.span_.data_ = kExpected;
      kExpected[0x10] = 0xa0;
      kExpected[0x11] = 'K';
      kExpected[0x12] = 0x91;
      kExpected[0x13] = 'X';
      kExpected[0x14] = '<';
      kExpected[0x15] = 0xf4;
      kExpected[0x16] = 0xe3;
      kExpected[0x17] = 'm';
      kExpected[0x18] = 0xff;
      kExpected[0x19] = 'A';
      kExpected[0x1a] = 0xbf;
      kExpected[0x1b] = 0xb9;
      kExpected[0x1c] = 0xf8;
      kExpected[0x1d] = 0xa8;
      kExpected[0x1e] = '\x1c';
      kExpected[0x1f] = '+';
      kExpected[0] = 'i';
      kExpected[1] = 'x';
      kExpected[2] = '\x15';
      kExpected[3] = 0x96;
      kExpected[4] = 0xca;
      kExpected[5] = 0xc0;
      kExpected[6] = '?';
      kExpected[7] = 'j';
      kExpected[8] = 'm';
      kExpected[9] = 0xed;
      kExpected[10] = '\"';
      kExpected[0xb] = '\x1e';
      kExpected[0xc] = '&';
      kExpected[0xd] = 0xd0;
      kExpected[0xe] = 'u';
      kExpected[0xf] = 'I';
      local_1e0.span_.size_ = 0x20;
      local_1b8.span_.size_ = 0x20;
      local_1b8.span_.data_ = digest;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar,"Bytes(kExpected)","Bytes(digest)",&local_1e0,&local_1b8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_1e0);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
                   ,0x5b,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b8,(Message *)&local_1e0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b8);
        if ((long *)local_1e0.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1e0.span_.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      CTR_DRBG_clear(&drbg);
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buf);
  }
  return;
}

Assistant:

TEST(CTRDRBGTest, Large) {
  const uint8_t kSeed[CTR_DRBG_ENTROPY_LEN] = {0};

  CTR_DRBG_STATE drbg;
  ASSERT_TRUE(CTR_DRBG_init(&drbg, kSeed, nullptr, 0));

  auto buf = std::make_unique<uint8_t[]>(CTR_DRBG_MAX_GENERATE_LENGTH);
  ASSERT_TRUE(CTR_DRBG_generate(&drbg, buf.get(), CTR_DRBG_MAX_GENERATE_LENGTH,
                                nullptr, 0));

  uint8_t digest[SHA256_DIGEST_LENGTH];
  SHA256(buf.get(), CTR_DRBG_MAX_GENERATE_LENGTH, digest);

  const uint8_t kExpected[SHA256_DIGEST_LENGTH] = {
      0x69, 0x78, 0x15, 0x96, 0xca, 0xc0, 0x3f, 0x6a, 0x6d, 0xed, 0x22,
      0x1e, 0x26, 0xd0, 0x75, 0x49, 0xa0, 0x4b, 0x91, 0x58, 0x3c, 0xf4,
      0xe3, 0x6d, 0xff, 0x41, 0xbf, 0xb9, 0xf8, 0xa8, 0x1c, 0x2b,
  };
  EXPECT_EQ(Bytes(kExpected), Bytes(digest));

  CTR_DRBG_clear(&drbg);
}